

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O1

void __thiscall BPlusTree::PrintNode(BPlusTree *this,shared_ptr<Node> *node)

{
  element_type *peVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      std::ostream::_M_insert<void_const*>(&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
      poVar2 = std::ostream::_M_insert<double>
                         ((double)*(float *)((long)(((node->
                                                  super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->keys).
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar4))
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
      peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 4;
    } while (uVar3 < (ulong)((long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::ostream::_M_insert<void_const*>(&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void BPlusTree::PrintNode(std::shared_ptr<Node> node) {
    std::cout << "[";
    for (int i = 0; i < node->keys.size(); i++) {
        std::cout << node->ptrs[i] << "|" << node->keys[i]<< "|";
    }
    std::cout << node->ptrs[node->ptrs.size()-1] << "]" << std::endl;
}